

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

int Aig_CutCheckDominance(Aig_Cut_t *pDom,Aig_Cut_t *pCut)

{
  int local_28;
  int local_24;
  int k;
  int i;
  Aig_Cut_t *pCut_local;
  Aig_Cut_t *pDom_local;
  
  local_24 = 0;
  while( true ) {
    if (pDom->nFanins <= local_24) {
      return 1;
    }
    local_28 = 0;
    while ((local_28 < pCut->nFanins &&
           (*(int *)((long)&pDom[1].pNext + (long)local_24 * 4) !=
            *(int *)((long)&pCut[1].pNext + (long)local_28 * 4)))) {
      local_28 = local_28 + 1;
    }
    if (local_28 == pCut->nFanins) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static inline int Aig_CutCheckDominance( Aig_Cut_t * pDom, Aig_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nFanins; i++ )
    {
        for ( k = 0; k < (int)pCut->nFanins; k++ )
            if ( pDom->pFanins[i] == pCut->pFanins[k] )
                break;
        if ( k == (int)pCut->nFanins ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}